

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O3

void dirNexAuto(void)

{
  bool bVar1;
  aint i;
  uint uVar2;
  long lVar3;
  aint *paVar4;
  uint uVar5;
  uint bankNum;
  char *pcVar6;
  bool optionals [2];
  aint autoArgs [2];
  bool local_22 [2];
  uint local_20;
  uint local_1c;
  
  if (nex.canAppend) {
    if (nex.lastBankIndex != 0x6f) {
      uVar5 = nex.lastBankIndex + 1;
      if (uVar5 < 8) {
        local_20 = nexBankOrder[uVar5];
      }
      else {
        local_20 = 0xffffffff;
        if (nex.lastBankIndex - 7U < 0x68) {
          local_20 = uVar5;
        }
      }
      local_1c = 0x6f;
      local_22[0] = true;
      local_22[1] = true;
      bVar1 = getIntArguments<2>(&lp,(aint (*) [2])&local_20,&local_22);
      if (local_1c < 0x70 && (local_20 < 0x70 && bVar1)) {
        uVar5 = local_20;
        if (0x67 < local_20 - 8) {
          paVar4 = nexBankOrder;
          lVar3 = 0;
          do {
            if (*paVar4 == local_20) {
              uVar5 = (uint)lVar3;
              goto LAB_00117fd4;
            }
            lVar3 = lVar3 + 1;
            paVar4 = (aint *)((uint *)paVar4 + 1);
          } while (lVar3 != 8);
          uVar5 = 0xfffffffe;
        }
LAB_00117fd4:
        uVar2 = local_1c;
        if (0x67 < local_1c - 8) {
          paVar4 = nexBankOrder;
          lVar3 = 0;
          do {
            if (*paVar4 == local_1c) {
              uVar2 = (uint)lVar3;
              goto LAB_00118003;
            }
            lVar3 = lVar3 + 1;
            paVar4 = (aint *)((uint *)paVar4 + 1);
          } while (lVar3 != 8);
          uVar2 = 0xfffffffe;
        }
LAB_00118003:
        if ((int)uVar5 <= (int)uVar2) {
          while( true ) {
            if (uVar5 < 8) {
              bankNum = nexBankOrder[uVar5];
            }
            else {
              bankNum = 0xffffffff;
              if (uVar5 - 8 < 0x68) {
                bankNum = uVar5;
              }
            }
            bVar1 = saveBank(uVar5,bankNum,true);
            if (uVar2 == uVar5) break;
            uVar5 = uVar5 + 1;
            if (!bVar1) {
              return;
            }
          }
          return;
        }
        pcVar6 = "[SAVENEX] \'toBank\' is less than \'fromBank\'";
      }
      else {
        pcVar6 = "[SAVENEX] expected syntax is AUTO [<fromBank 0..111>[,<toBank 0..111>]]";
      }
      Error(pcVar6,bp,SUPPRESS);
      return;
    }
    pcVar6 = "[SAVENEX] all banks are already stored";
  }
  else {
    pcVar6 = "[SAVENEX] NEX file is not open";
  }
  Error(pcVar6,(char *)0x0,SUPPRESS);
  return;
}

Assistant:

static void dirNexAuto() {
	if (!nex.canAppend) {
		Error("[SAVENEX] NEX file is not open", NULL, SUPPRESS);
		return;
	}
	if (SNexHeader::MAX_BANK-1 == nex.lastBankIndex) {	// actually there's nothing left to scan
		Error("[SAVENEX] all banks are already stored", NULL, SUPPRESS);
		return;
	}
	// parse arguments
	aint autoArgs[2] = { getNexBankNum(nex.lastBankIndex+1), SNexHeader::MAX_BANK-1 };
	const bool optionals[] = {true, true};
	if (!getIntArguments<2>(lp, autoArgs, optionals)
			|| autoArgs[0] < 0 || SNexHeader::MAX_BANK <= autoArgs[0]
			|| autoArgs[1] < 0 || SNexHeader::MAX_BANK <= autoArgs[1]) {
		Error("[SAVENEX] expected syntax is AUTO [<fromBank 0..111>[,<toBank 0..111>]]", bp, SUPPRESS);
		return;
	}
	// validate arguments
	aint fromI = getNexBankIndex(autoArgs[0]), toI = getNexBankIndex(autoArgs[1]);
	if (toI < fromI) {
		Error("[SAVENEX] 'toBank' is less than 'fromBank'", bp, SUPPRESS);
		return;
	}
	while (fromI <= toI) {
		if (!saveBank(fromI, getNexBankNum(fromI), true)) return;
		++fromI;
	}
}